

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O3

Atom_t __thiscall Potassco::ProgramReader::matchAtom(ProgramReader *this,char *err)

{
  bool bVar1;
  uint uVar2;
  BufferedStream *this_00;
  int64_t x;
  ulong local_20;
  
  this_00 = stream(this);
  uVar2 = this->varMax_;
  bVar1 = BufferedStream::match(this_00,(int64_t *)&local_20,false);
  if (((!bVar1) || ((long)local_20 < 1)) || (uVar2 < local_20)) {
    uVar2 = BufferedStream::line(this_00);
    BufferedStream::fail(uVar2,err);
  }
  return (Atom_t)local_20;
}

Assistant:

Atom_t   matchAtom(const char* err = "atom expected") { return Potassco::matchAtom(*stream(), varMax_, err); }